

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_AddClausesSuper(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Ptr_t *vSuper,satoko_t *pSat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *lits;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int local_4c;
  int i;
  int RetValue;
  int nLits;
  int *pLits;
  Gia_Obj_t *pFanin;
  int fPolarFlip;
  satoko_t *pSat_local;
  Vec_Ptr_t *vSuper_local;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe8,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar1 = Gia_ObjIsAnd(pNode);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe9,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar1 = Vec_PtrSize(vSuper);
  lits = (int *)malloc((long)(iVar1 + 1) << 2);
  for (local_4c = 0; iVar2 = Vec_PtrSize(vSuper), local_4c < iVar2; local_4c = local_4c + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vSuper,local_4c);
    pGVar5 = Gia_Regular(pGVar4);
    iVar2 = Cec2_ObjSatId(p,pGVar5);
    iVar3 = Gia_IsComplement(pGVar4);
    iVar2 = Abc_Var2Lit(iVar2,iVar3);
    *lits = iVar2;
    iVar2 = Cec2_ObjSatId(p,pNode);
    iVar2 = Abc_Var2Lit(iVar2,1);
    lits[1] = iVar2;
    iVar2 = satoko_add_clause(pSat,lits,2);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0xf9,
                    "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
    }
  }
  for (local_4c = 0; iVar2 = Vec_PtrSize(vSuper), local_4c < iVar2; local_4c = local_4c + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vSuper,local_4c);
    pGVar5 = Gia_Regular(pGVar4);
    iVar2 = Cec2_ObjSatId(p,pGVar5);
    iVar3 = Gia_IsComplement(pGVar4);
    iVar2 = Abc_Var2Lit(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
    lits[local_4c] = iVar2;
  }
  iVar2 = Cec2_ObjSatId(p,pNode);
  iVar2 = Abc_Var2Lit(iVar2,0);
  lits[iVar1] = iVar2;
  iVar1 = satoko_add_clause(pSat,lits,iVar1 + 1);
  if (iVar1 != 0) {
    if (lits != (int *)0x0) {
      free(lits);
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                ,0x10a,
                "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
}

Assistant:

void Cec2_AddClausesSuper( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Ptr_t * vSuper, satoko_t * pSat )
{
    int fPolarFlip = 0;
    Gia_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), Gia_IsComplement(pFanin));
        pLits[1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 1);
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[0] = Abc_LitNot( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = Abc_LitNot( pLits[1] );
        }
        RetValue = satoko_add_clause( pSat, pLits, 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), !Gia_IsComplement(pFanin));
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[i] = Abc_LitNot( pLits[i] );
        }
    }
    pLits[nLits-1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 0);
    if ( fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = Abc_LitNot( pLits[nLits-1] );
    }
    RetValue = satoko_add_clause( pSat, pLits, nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}